

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3bbc00::CpuZeropageTest_rra_zero_sets_n_and_v_Test::
~CpuZeropageTest_rra_zero_sets_n_and_v_Test(CpuZeropageTest_rra_zero_sets_n_and_v_Test *this)

{
  IMos6502 *pIVar1;
  void *in_RAX;
  
  (this->super_CpuZeropageTest).super_CpuTest.super_Test._vptr_Test =
       (_func_int **)&PTR__CpuTest_002a07b0;
  testing::InSequence::~InSequence(&(this->super_CpuZeropageTest).super_CpuTest.in_sequence);
  pIVar1 = (this->super_CpuZeropageTest).super_CpuTest.cpu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>
           ._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
           .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl;
  if (pIVar1 != (IMos6502 *)0x0) {
    (*(pIVar1->super_ICpu)._vptr_ICpu[1])();
  }
  (this->super_CpuZeropageTest).super_CpuTest.cpu._M_t.
  super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>.
  super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl = (IMos6502 *)0x0;
  (this->super_CpuZeropageTest).super_CpuTest.mmu.super_MockMmu.super_IMmu._vptr_IMmu =
       (_func_int **)&PTR__MockMmu_002a0898;
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::~FunctionMocker
            (&(this->super_CpuZeropageTest).super_CpuTest.mmu.super_MockMmu.gmock02_write_byte_15);
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::~FunctionMocker
            (&(this->super_CpuZeropageTest).super_CpuTest.mmu.super_MockMmu.gmock11_read_byte_14);
  testing::internal::
  FunctionMocker<void_(std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>)>
  ::~FunctionMocker(&(this->super_CpuZeropageTest).super_CpuTest.mmu.super_MockMmu.
                     gmock01_set_mem_banks_12);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuZeropageTest, rra_zero_sets_n_and_v) {
    registers.p = Z_FLAG;
    registers.a = 0b0100'0000;
    expected.a = 0b1000'0000;
    expected.p = N_FLAG | V_FLAG;
    memory_content = 0b1000'0000;
    run_readwrite_instruction(RRA_ZERO, 0b0100'0000);
}